

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

uint32_t get_nfc(uint32_t uc,uint32_t uc2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar3 = 0x3a2;
  do {
    iVar1 = (iVar3 + iVar2) / 2;
    if (u_composition_table[iVar1].cp1 < uc) {
LAB_001469ae:
      iVar2 = iVar1 + 1;
    }
    else {
      if (u_composition_table[iVar1].cp1 <= uc) {
        if (u_composition_table[iVar1].cp2 < uc2) goto LAB_001469ae;
        if (u_composition_table[iVar1].cp2 <= uc2) {
          return u_composition_table[iVar1].nfc;
        }
      }
      iVar3 = iVar1 + -1;
    }
    if (iVar3 < iVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

static uint32_t
get_nfc(uint32_t uc, uint32_t uc2)
{
	int t, b;

	t = 0;
	b = sizeof(u_composition_table)/sizeof(u_composition_table[0]) -1;
	while (b >= t) {
		int m = (t + b) / 2;
		if (u_composition_table[m].cp1 < uc)
			t = m + 1;
		else if (u_composition_table[m].cp1 > uc)
			b = m - 1;
		else if (u_composition_table[m].cp2 < uc2)
			t = m + 1;
		else if (u_composition_table[m].cp2 > uc2)
			b = m - 1;
		else
			return (u_composition_table[m].nfc);
	}
	return (0);
}